

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O3

bool __thiscall
glcts::TextureCubeMapArrayColorDepthAttachmentsTest::verifyDepth16Data
          (TextureCubeMapArrayColorDepthAttachmentsTest *this,_texture_size *texture_size,
          GLuint n_layer)

{
  uint uVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  long lVar3;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  pvVar4 = operator_new__((ulong)(texture_size->m_size * texture_size->m_size) * 2);
  (**(code **)(lVar3 + 0xff0))(0xd05,2);
  uVar8 = 0;
  (**(code **)(lVar3 + 0x1220))
            (0,0,texture_size->m_size,texture_size->m_size,0x1902,this->m_depth_type,pvVar4);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"glReadPixels() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x441);
  uVar1 = texture_size->m_size;
  uVar5 = (ulong)uVar1;
  bVar9 = true;
  if (uVar5 != 0) {
    lVar6 = 0;
    bVar10 = false;
    do {
      uVar7 = 0;
      do {
        bVar9 = bVar10;
        if (*(short *)((long)pvVar4 + (ulong)(uint)((int)lVar6 + (int)uVar7) * 2) != (short)n_layer)
        goto LAB_00d57dfc;
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + uVar5;
      bVar10 = uVar1 <= uVar8;
      bVar9 = true;
    } while (uVar8 != uVar1);
  }
LAB_00d57dfc:
  operator_delete__(pvVar4);
  (**(code **)(lVar3 + 0xff0))(0xd05,4);
  return bVar9;
}

Assistant:

bool TextureCubeMapArrayColorDepthAttachmentsTest::verifyDepth16Data(const _texture_size& texture_size,
																	 glw::GLuint		  n_layer)
{
	/* Allocate buffer for the data we will retrieve from the implementation */
	glw::GLushort		  expected_value   = (glw::GLushort)n_layer;
	const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
	bool				  result		   = false;
	const glw::GLuint	 result_data_size = texture_size.m_size * texture_size.m_size;
	glw::GLushort*		  result_data	  = new glw::GLushort[result_data_size];

	DE_ASSERT(result_data != NULL);

	gl.pixelStorei(GL_PACK_ALIGNMENT, 2);

	/* Read the data */
	gl.readPixels(0, /* x */
				  0, /* y */
				  texture_size.m_size, texture_size.m_size, m_depth_format, m_depth_type, result_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed");

	/* Verify image, expected value is layer index */
	result = verifyImage<glw::GLushort, 1>(texture_size.m_size, texture_size.m_size, &expected_value, result_data);

	/* Release the buffer */
	if (result_data != NULL)
	{
		delete[] result_data;

		result_data = NULL;
	}

	gl.pixelStorei(GL_PACK_ALIGNMENT, 4);

	return result;
}